

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NekoLib.hpp
# Opt level: O2

FunctionReturned *
readFloat(FunctionReturned *__return_storage_ptr__,vector<Item,_std::allocator<Item>_> *input)

{
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  Item local_80;
  
  if ((input->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (input->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&local_150);
    std::__cxx11::string::string((string *)&local_f0,&local_150);
    getToken((Token *)local_a8,&local_f0);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::__cxx11::string::~string((string *)&local_f0);
    if (local_a8._0_4_ == FloatNumber) {
      std::__cxx11::string::string((string *)&local_110,&local_150);
      getToken((Token *)local_d0,&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"Float",(allocator<char> *)local_a8);
      Item::Item(&local_80,(Token *)local_d0,&local_130);
      FunctionReturned::FunctionReturned(__return_storage_ptr__,&local_80);
      Item::~Item(&local_80);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)(local_d0 + 8));
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      FunctionReturned::FunctionReturned(__return_storage_ptr__,(Exception)0xffffffff00000008);
    }
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    FunctionReturned::FunctionReturned(__return_storage_ptr__,(Exception)0xffffffff00000024);
  }
  return __return_storage_ptr__;
}

Assistant:

FunctionReturned readFloat(vector<Item> &input) {
	if (input.size() > 0) {
		return Exception(FunctionArgumentExcess);
	}
	string s;
	cin >> s;
	if (getToken(s).type != FloatNumber) {
		return Exception(InputError);
	}
	return Item(getToken(s), "Float");
}